

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void freeStack(Stack stack)

{
  Data data;
  
  while (stack->size != 0) {
    data = pop(stack);
    deepFreeData(data);
  }
  free(stack);
  return;
}

Assistant:

void freeStack(Stack stack) {
    while (stack->size) {
        deepFreeData(pop(stack));
    }
    free(stack);
}